

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derLDec(size_t *len,octet *der,size_t count)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar5;
  bool bVar6;
  size_t sVar7;
  ulong uVar4;
  
  sVar2 = 0xffffffffffffffff;
  if (count != 0) {
    bVar1 = *der;
    sVar7 = (size_t)bVar1;
    if ((bVar1 != 0x80) && (bVar1 != 0xff)) {
      if ((char)bVar1 < '\0') {
        uVar3 = bVar1 & 0x7f;
        uVar4 = (ulong)uVar3;
        bVar6 = 8 < (bVar1 & 0x7f) || count <= uVar4;
        sVar7 = (size_t)bVar6;
        if (((bVar6) || (der[1] == '\0')) ||
           (sVar7 = (size_t)(uVar3 == 1), uVar3 == 1 && -1 < (char)der[1])) {
          bVar6 = false;
        }
        else {
          if (uVar4 == 0) {
            sVar7 = 0;
          }
          else {
            uVar5 = 0;
            sVar7 = 0;
            do {
              sVar7 = sVar7 << 8 | (ulong)der[uVar5 + 1];
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
          bVar6 = sVar7 != 0xffffffffffffffff;
        }
        if (!bVar6) {
          return 0xffffffffffffffff;
        }
        sVar2 = uVar4 + 1;
      }
      else {
        sVar2 = 1;
      }
      if (len != (size_t *)0x0) {
        *len = sVar7;
      }
    }
  }
  return sVar2;
}

Assistant:

static size_t derLDec(size_t* len, const octet der[], size_t count)
{
	size_t l_count = 1;
	size_t l;
	// не хватает буфера? неявная форма (0x80)? запрещенный октет (0xFF)?
	if (count < l_count || der[0] == 128 || der[0] == 255)
		return SIZE_MAX;
	// короткая форма?
	if (der[0] < 128)
		l = der[0];
	// длинная форма
	else
	{
		size_t r = der[0] - 128;
		l_count += r;
		// не хватает буфера? переполнение?
		// нулевой старший октет кода длины?
		// длина меньше 128?
		if (count < l_count || r > O_PER_S ||
			der[1] == 0 || 
			r == 1 && der[1] < 128)
			return SIZE_MAX;
		for (l = 0, r = 1; r < l_count; ++r)
			 l <<= 8, l |= (size_t)der[r];
		// переполнение?
		if (l == SIZE_MAX)
			return SIZE_MAX;
	}
	// возврат
	if (len)
	{
		ASSERT(memIsValid(len, sizeof(size_t)));
		*len = l;
	}
	return l_count;
}